

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O3

vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> * __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertToStruct
          (vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *__return_storage_ptr__,
          JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *this)

{
  pointer pPVar1;
  pointer this_00;
  PsbtMapDataStruct data;
  PsbtMapDataStruct local_a0;
  
  (__return_storage_ptr__->super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_JsonVector<cfd::api::json::PsbtMapData>).
            super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
            super__Vector_base<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->super_JsonVector<cfd::api::json::PsbtMapData>).
           super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
           super__Vector_base<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pPVar1) {
    do {
      cfd::api::json::PsbtMapData::ConvertToStruct(&local_a0,this_00);
      ::std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::push_back
                (__return_storage_ptr__,&local_a0);
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_a0.ignore_items._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.value._M_dataplus._M_p != &local_a0.value.field_2) {
        operator_delete(local_a0.value._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.key._M_dataplus._M_p != &local_a0.key.field_2) {
        operator_delete(local_a0.key._M_dataplus._M_p);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pPVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }